

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int __thiscall
CVmObjDate::getp_getDate(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int32_t *piVar1;
  int iVar2;
  CVmTimeZone *this_00;
  uint argc;
  int32_t daytime;
  int32_t dayno;
  caldate_t cd;
  int32_t local_34;
  int32_t local_30;
  caldate_t local_2c;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_getDate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getDate();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getDate::desc);
  if (iVar2 == 0) {
    this_00 = get_tz_arg(0,argc);
    piVar1 = (int32_t *)(this->super_CVmObject).ext_;
    local_30 = *piVar1;
    local_34 = piVar1[1];
    CVmTimeZone::utc_to_local(this_00,&local_30,&local_34,&local_2c.y);
    caldate_t::set_dayno(&local_2c,local_30);
    make_int_list(retval,4);
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getDate(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date in local time */
    int32_t dayno = get_local_date(get_tz_arg(vmg_ 0, argc));

    /* express it as a calendar date */
    caldate_t cd(dayno);

    /* return [year, month, monthday, weekday] */
    make_int_list(vmg_ retval, 4, cd.y, cd.m, cd.d, cd.weekday() + 1);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}